

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  LogMessage *other;
  ulong uVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  uVar1 = value->_M_string_length;
  if ((uVar1 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x20e);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    uVar1 = value->_M_string_length;
  }
  io::CodedOutputStream::WriteVarint32(output,(uint32)uVar1);
  io::CodedOutputStream::WriteString(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}